

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraSublimeTextGenerator::ComputeIncludes_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  pointer pcVar1;
  string *config;
  char *expression;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_118;
  string local_f8;
  string INCLUDE_DIRECTORIES;
  string local_b8;
  cmGeneratorExpressionInterpreter genexInterpreter;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = lg->Makefile;
  cmSourceFile::GetLanguage_abi_cxx11_(&local_f8,source);
  genexInterpreter.GeneratorExpression.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&genexInterpreter.CompiledGeneratorExpression;
  std::__cxx11::string::_M_construct<char_const*>((string *)&genexInterpreter,"CMAKE_BUILD_TYPE","")
  ;
  config = cmMakefile::GetSafeDefinition(this_00,(string *)&genexInterpreter);
  if (genexInterpreter.GeneratorExpression.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&genexInterpreter.CompiledGeneratorExpression) {
    operator_delete(genexInterpreter.GeneratorExpression.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(long)genexInterpreter.CompiledGeneratorExpression._M_t.
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl + 1);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar1 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + config->_M_string_length);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_f8._M_dataplus._M_p,
             local_f8._M_dataplus._M_p + local_f8._M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,lg,&local_118,target,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  INCLUDE_DIRECTORIES._M_dataplus._M_p = (pointer)&INCLUDE_DIRECTORIES.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&INCLUDE_DIRECTORIES,"INCLUDE_DIRECTORIES","");
  expression = cmSourceFile::GetProperty(source,&INCLUDE_DIRECTORIES);
  if (expression != (char *)0x0) {
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       (&genexInterpreter,expression,&INCLUDE_DIRECTORIES);
    cmLocalGenerator::AppendIncludeDirectories(lg,&includes,(psVar2->_M_dataplus)._M_p,source);
  }
  cmLocalGenerator::GetIncludeDirectories(lg,&includes,target,&local_f8,config);
  cmLocalGenerator::GetIncludeFlags
            (__return_storage_ptr__,lg,&includes,target,&local_f8,true,false,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)INCLUDE_DIRECTORIES._M_dataplus._M_p != &INCLUDE_DIRECTORIES.field_2) {
    operator_delete(INCLUDE_DIRECTORIES._M_dataplus._M_p,
                    INCLUDE_DIRECTORIES.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)genexInterpreter.Language._M_dataplus._M_p != &genexInterpreter.Language.field_2) {
    operator_delete(genexInterpreter.Language._M_dataplus._M_p,
                    genexInterpreter.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)genexInterpreter.Config._M_dataplus._M_p != &genexInterpreter.Config.field_2) {
    operator_delete(genexInterpreter.Config._M_dataplus._M_p,
                    genexInterpreter.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&genexInterpreter.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&genexInterpreter.GeneratorExpression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeIncludes(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::vector<std::string> includes;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, target,
                                                    language);

  // Add include directories for this source file
  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (const char* cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    lg->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  // Add include directory flags.
  lg->GetIncludeDirectories(includes, target, language, config);

  std::string includesString =
    lg->GetIncludeFlags(includes, target, language, true, false, config);

  return includesString;
}